

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.cpp
# Opt level: O0

Instruction *
stackjit::Loader::Instruction::makeCallInstance
          (Instruction *__return_storage_ptr__,string *classType,string *funcName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  string *funcName_local;
  string *classType_local;
  Instruction *instruction;
  
  Instruction(__return_storage_ptr__,CallInstance,CALL_INSTANCE);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->mCalledClassType,(string *)classType);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->mStringValue,(string *)funcName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->mCallParameters,parameters);
  return __return_storage_ptr__;
}

Assistant:

Loader::Instruction Loader::Instruction::makeCallInstance(std::string classType, std::string funcName, std::vector<std::string> parameters) {
		Loader::Instruction instruction(InstructionFormats::CallInstance, OpCodes::CALL_INSTANCE);
		instruction.mCalledClassType = classType;
		instruction.mStringValue = funcName;
		instruction.mCallParameters = parameters;
		return instruction;
	}